

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O3

int alex::fanout_tree::find_best_fanout_existing_node<int,int>
              (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *parent,int bucketID,
              int total_keys,
              vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              *used_fanout_tree_nodes,int max_fanout)

{
  double dVar1;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this;
  uint64_t *puVar2;
  pointer pFVar3;
  pointer pFVar4;
  FTNode *pFVar5;
  iterator __position;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __first;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __last;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined7 uVar13;
  vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *this_00;
  ulong uVar14;
  bool *pbVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint left;
  int iVar22;
  uint64_t uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  FTNode *tree_node;
  FTNode *__args;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  longdouble lVar40;
  longdouble lVar41;
  longdouble lVar42;
  longdouble lVar43;
  longdouble lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_ZMM3 [64];
  double cost;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  vector<double,_std::allocator<double>_> fanout_costs;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  LinearModel<int> model;
  DataNodeStats stats;
  int local_1f0;
  int local_1ec;
  double local_1e8;
  int local_1dc;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> local_1d8;
  double local_1c0;
  void *local_1b8;
  iterator iStack_1b0;
  double *local_1a8;
  double local_198;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  local_178;
  double local_158;
  double local_150;
  LinearModelBuilder<int> local_148;
  LinearModel<int> local_d8;
  vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *local_c0;
  double local_b8;
  ulong local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  DataNodeStats local_88;
  undefined1 local_78 [64];
  int local_38;
  undefined4 uStack_34;
  
  this = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
         parent->children_[bucketID];
  local_18c = this->num_keys_;
  local_1a8 = (double *)0x0;
  local_1b8 = (void *)0x0;
  iStack_1b0._M_current = (double *)0x0;
  local_178.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar22 = 1 << ((this->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  dVar1 = (parent->super_AlexNode<int,_int>).model_.a_;
  local_98 = ZEXT816(0);
  iVar16 = bucketID - bucketID % iVar22;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auVar46._8_8_ = dVar1;
    auVar46._0_8_ = dVar1;
    auVar27 = vpinsrd_avx(ZEXT416((uint)(iVar22 + iVar16)),iVar16,1);
    auVar27 = vcvtdq2pd_avx(auVar27);
    dVar1 = (parent->super_AlexNode<int,_int>).model_.b_;
    auVar28._8_8_ = dVar1;
    auVar28._0_8_ = dVar1;
    auVar27 = vsubpd_avx512vl(auVar27,auVar28);
    auVar27 = vdivpd_avx(auVar27,auVar46);
    auVar28 = vhsubpd_avx(auVar27,auVar27);
    auVar27 = vshufpd_avx(auVar27,auVar27,1);
    local_98._0_8_ = 1.0 / auVar28._0_8_;
    local_98._8_8_ = 0;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar28 = vxorpd_avx512vl(local_98,auVar6);
    local_158 = auVar27._0_8_ * auVar28._0_8_;
  }
  else {
    auVar27._8_8_ = 0x8000000000000000;
    auVar27._0_8_ = 0x8000000000000000;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (double)iVar16 - (parent->super_AlexNode<int,_int>).model_.b_;
    auVar27 = vxorpd_avx512vl(auVar45,auVar27);
    local_158 = auVar27._0_8_ / (double)iVar22;
  }
  local_150 = (double)local_18c;
  uVar14 = 1;
  local_1f0 = 0;
  local_1ec = 0;
  local_b8 = (double)total_keys;
  local_1c0 = 1.79769313486232e+308;
  local_188 = total_keys;
  local_184 = max_fanout;
  local_c0 = (vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *)
             used_fanout_tree_nodes;
  do {
    iVar22 = (int)uVar14;
    iVar16 = iVar22 + -1;
    local_1d8.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (FTNode *)0x0;
    local_1e8 = 0.0;
    local_1d8.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (FTNode *)0x0;
    local_a8 = (double)iVar22;
    local_198 = local_a8 * (double)local_98._0_8_;
    iVar20 = 0;
    uVar19 = 0;
    local_a0 = local_a8 * local_158;
    local_1dc = iVar16;
    local_b0 = uVar14;
    do {
      if (iVar20 == iVar16) {
        uVar21 = this->data_capacity_;
      }
      else {
        local_148.model_ = (LinearModel<int> *)(((double)(iVar20 + 1) - local_a0) / local_198);
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        uVar21 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 ::lower_bound<double>(this,(double *)&local_148);
      }
      left = (uint)uVar19;
      if (left == uVar21) {
        local_148.y_sum_._8_2_ = 0;
        local_148._42_2_ = 0;
        local_148._44_4_ = 0;
        local_148.xx_sum_._0_4_ = 0;
        local_148.xx_sum_._4_6_ = 0;
        local_148._58_2_ = 0;
        local_148._60_4_ = 0;
        local_148.xy_sum_._0_4_ = 0;
        local_148.count_ = 0;
        local_148._12_4_ = 0;
        local_148.x_sum_._8_2_ = 0;
        local_148._26_6_ = 0;
        local_148.y_sum_._0_4_ = 0;
        local_148.y_sum_._4_4_ = 0;
        local_148.model_._0_4_ = local_1ec;
        local_148.x_sum_._0_4_ = left;
        local_148.x_sum_._4_4_ = left;
        if (local_1d8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1d8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
          local_148.model_._4_4_ = iVar20;
          std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
          _M_realloc_insert<alex::fanout_tree::FTNode>
                    (&local_1d8,
                     (iterator)
                     local_1d8.
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(FTNode *)&local_148);
        }
        else {
          *(ulong *)&(local_1d8.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->num_keys =
               (ulong)local_148.xy_sum_._4_4_ << 0x20;
          auVar29 = ZEXT2464(CONCAT420(left,CONCAT416(left,CONCAT88(0,CONCAT44(iVar20,local_1ec)))))
          ;
          local_148.model_ = (LinearModel<int> *)CONCAT44(iVar20,local_1ec);
LAB_0013a644:
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->level = auVar29._0_4_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->node_id = auVar29._4_4_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->cost = (double)auVar29._8_8_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->left_boundary = auVar29._16_4_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->right_boundary = auVar29._20_4_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->use = (bool)auVar29[0x18];
          *(int7 *)&(local_1d8.
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->field_0x19 = auVar29._25_7_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_search_iterations =
               (double)auVar29._32_8_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_shifts = (double)auVar29._40_8_
          ;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->a = (double)auVar29._48_8_;
          (local_1d8.
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish)->b = (double)auVar29._56_8_;
          local_1d8.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1d8.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        uVar17 = (int)left >> 6;
        local_d8.a_ = 0.0;
        local_d8.b_ = 0.0;
        puVar2 = this->bitmap_;
        uVar23 = (puVar2[(int)uVar17] >> (uVar19 & 0x3f)) << (uVar19 & 0x3f);
        if (uVar23 == 0) {
          uVar24 = (ulong)this->bitmap_size_;
          uVar19 = (long)(int)uVar17 + 1;
          uVar14 = uVar24;
          if ((long)uVar24 < (long)uVar19) {
            uVar14 = uVar19;
          }
          do {
            if ((long)uVar24 <= (long)uVar19) {
              uVar25 = 0xffffffff;
              uVar23 = 0;
              goto LAB_0013a3b5;
            }
            uVar23 = puVar2[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar23 == 0);
          uVar17 = (int)uVar19 - 1;
        }
        uVar14 = (ulong)uVar17;
        uVar25 = 0;
        for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          uVar25 = uVar25 + 1;
        }
        uVar25 = uVar25 | uVar17 << 6;
        uVar23 = uVar23 - 1 & uVar23;
LAB_0013a3b5:
        local_148.model_ = &local_d8;
        local_148.count_ = 0;
        lVar43 = (longdouble)0;
        local_148.x_sum_._0_4_ = SUB104(lVar43,0);
        local_148.x_sum_._4_4_ = (uint)((unkuint10)lVar43 >> 0x20);
        local_148.x_sum_._8_2_ = (undefined2)((unkuint10)lVar43 >> 0x40);
        local_148.xx_sum_._4_6_ = (undefined6)((unkuint10)lVar43 >> 0x20);
        local_148.x_min_ = 0x7fffffff;
        local_148.x_max_ = -0x80000000;
        local_148.y_min_ = 1.79769313486232e+308;
        local_148.y_max_ = -1.79769313486232e+308;
        local_148.y_sum_._0_4_ = local_148.x_sum_._0_4_;
        local_148.y_sum_._4_4_ = local_148.x_sum_._4_4_;
        local_148.y_sum_._8_2_ = local_148.x_sum_._8_2_;
        local_148.xx_sum_._0_4_ = local_148.x_sum_._0_4_;
        local_148.xy_sum_._0_4_ = local_148.x_sum_._0_4_;
        local_148.xy_sum_._4_4_ = local_148.x_sum_._4_4_;
        local_148.xy_sum_._8_2_ = local_148.x_sum_._8_2_;
        if (uVar25 != 0xffffffff && (int)uVar25 < (int)uVar21) {
          auVar28 = ZEXT816(0x7fefffffffffffff);
          auVar27 = ZEXT816(0xffefffffffffffff);
          local_148.x_max_ = -0x80000000;
          local_148.x_min_ = 0x7fffffff;
          lVar43 = (longdouble)0;
          lVar42 = lVar43;
          lVar41 = lVar43;
          lVar44 = lVar43;
          local_148.count_ = 0;
          do {
            local_180 = local_148.count_;
            local_148.count_ = local_180 + 1;
            auVar49._0_8_ = (double)local_180;
            auVar49._8_8_ = in_ZMM3._8_8_;
            local_17c = this->key_slots_[(int)uVar25];
            auVar28 = vminsd_avx(auVar28,auVar49);
            auVar27 = vmaxsd_avx(auVar27,auVar49);
            lVar40 = (longdouble)local_17c;
            lVar41 = lVar41 + lVar40;
            if (local_17c <= local_148.x_min_) {
              local_148.x_min_ = local_17c;
            }
            iVar16 = local_17c;
            if (local_17c < local_148.x_max_) {
              iVar16 = local_148.x_max_;
            }
            local_148.x_max_ = iVar16;
            lVar42 = lVar42 + (longdouble)local_180;
            lVar43 = lVar40 * lVar40 + lVar43;
            lVar44 = (longdouble)local_180 * lVar40 + lVar44;
            if (uVar23 == 0) {
              lVar26 = (long)(int)uVar14;
              do {
                lVar26 = lVar26 + 1;
                if (this->bitmap_size_ <= lVar26) goto LAB_0013a504;
                uVar23 = puVar2[lVar26];
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (uVar23 == 0);
            }
            uVar25 = 0;
            for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              uVar25 = uVar25 + 1;
            }
            uVar25 = uVar25 | (int)uVar14 << 6;
          } while (((int)uVar25 < (int)uVar21) &&
                  (uVar23 = uVar23 - 1 & uVar23, uVar25 != 0xffffffff));
LAB_0013a504:
          local_148.x_sum_._0_4_ = SUB104(lVar41,0);
          local_148.x_sum_._4_4_ = (uint)((unkuint10)lVar41 >> 0x20);
          local_148.x_sum_._8_2_ = (undefined2)((unkuint10)lVar41 >> 0x40);
          local_148.y_sum_._0_4_ = SUB104(lVar42,0);
          local_148.y_sum_._4_4_ = (uint)((unkuint10)lVar42 >> 0x20);
          local_148.y_sum_._8_2_ = (undefined2)((unkuint10)lVar42 >> 0x40);
          local_148.xx_sum_._0_4_ = SUB104(lVar43,0);
          local_148.xx_sum_._4_6_ = (undefined6)((unkuint10)lVar43 >> 0x20);
          local_148.xy_sum_._0_4_ = SUB104(lVar44,0);
          local_148.xy_sum_._4_4_ = (uint)((unkuint10)lVar44 >> 0x20);
          local_148.xy_sum_._8_2_ = (undefined2)((unkuint10)lVar44 >> 0x40);
          local_148.y_min_ = auVar28._0_8_;
          local_148.y_max_ = auVar27._0_8_;
        }
        iVar16 = local_148.count_;
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        LinearModelBuilder<int>::build(&local_148);
        iVar18 = this->num_lookups_ + this->num_inserts_;
        local_88.num_search_iterations = 0.0;
        local_88.num_shifts = 0.0;
        local_78._8_8_ =
             AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             compute_expected_cost_from_existing
                       (this,left,uVar21,0.7,
                        (double)((ulong)(iVar18 != 0) *
                                (long)((double)this->num_inserts_ / (double)iVar18)),&local_d8,
                        &local_88);
        local_78._56_8_ = local_d8.b_;
        local_78._48_8_ = local_d8.a_;
        local_78._0_4_ = local_1ec;
        local_78[0x18] = false;
        local_78._32_8_ = local_88.num_search_iterations;
        local_78._40_8_ = local_88.num_shifts;
        local_1e8 = ((double)local_78._8_8_ * (double)iVar16) / local_150 + local_1e8;
        local_78._4_4_ = iVar20;
        local_78._16_4_ = left;
        local_78._20_4_ = uVar21;
        local_38 = iVar16;
        if (local_1d8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1d8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *(ulong *)&(local_1d8.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->num_keys =
               CONCAT44(uStack_34,iVar16);
          auVar29._4_4_ = iVar20;
          auVar29._0_4_ = local_1ec;
          auVar29._8_8_ = local_78._8_8_;
          auVar29._16_4_ = left;
          auVar29._20_4_ = uVar21;
          auVar29[0x18] = 0;
          auVar29._25_7_ = local_78._25_7_;
          auVar29._32_8_ = local_88.num_search_iterations;
          auVar29._40_8_ = local_88.num_shifts;
          auVar29._48_16_ = local_78._48_16_;
          iVar16 = local_1dc;
          goto LAB_0013a644;
        }
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        _M_realloc_insert<alex::fanout_tree::FTNode>
                  (&local_1d8,
                   (iterator)
                   local_1d8.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FTNode *)local_78);
        iVar16 = local_1dc;
      }
      iVar20 = iVar20 + 1;
      uVar19 = (ulong)uVar21;
    } while (iVar20 != iVar22 + (uint)(iVar22 == 0));
    local_1e8 = (local_a8 * 5e-07 * 208.0 * local_b8) / local_150 + 20.0 + local_1e8;
    if (iStack_1b0._M_current == local_1a8) {
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_1b8,iStack_1b0,&local_1e8);
    }
    else {
      *iStack_1b0._M_current = local_1e8;
      iStack_1b0._M_current = iStack_1b0._M_current + 1;
    }
    uVar14 = (long)iStack_1b0._M_current - (long)local_1b8;
    if (((uVar14 < 0x11) ||
        (dVar1 = *(double *)((long)local_1b8 + (uVar14 - 0x10)),
        *(double *)((long)local_1b8 + (uVar14 - 8)) <= dVar1)) ||
       (dVar1 <= *(double *)((long)local_1b8 + (uVar14 - 0x18)))) {
      local_198 = local_1e8;
      if (local_1e8 < local_1c0) {
        local_1f0 = local_1ec;
      }
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back(&local_178,&local_1d8);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_198;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_1c0;
      bVar11 = true;
      auVar27 = vminsd_avx(auVar47,auVar48);
      local_1c0 = auVar27._0_8_;
    }
    else {
      bVar11 = false;
    }
    if (local_1d8.
        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      operator_delete(local_1d8.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this_00 = local_c0;
    if (!bVar11) break;
    local_1ec = local_1ec + 1;
    uVar21 = (int)local_b0 * 2;
    uVar14 = (ulong)uVar21;
  } while ((int)uVar21 <= local_184);
  pFVar3 = local_178.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_1f0].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar4 = local_178.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_1f0].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar4) {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pbVar15 = &pFVar3[0x3f].use;
    uVar14 = 0;
    auVar37 = vpbroadcastq_avx512f();
    auVar37 = vpsrlq_avx512f(auVar37,6);
    do {
      auVar38 = vpbroadcastq_avx512f();
      auVar39 = vporq_avx512f(auVar38,auVar36);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0x11b8] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0x1170] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0x1128] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0x10e0] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0x1098] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x1050] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x1008] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0xfc0] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar35);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0xf78] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0xf30] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0xee8] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0xea0] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0xe58] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0xe10] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0xdc8] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0xd80] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar34);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0xd38] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0xcf0] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0xca8] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0xc60] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0xc18] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0xbd0] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0xb88] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0xb40] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar33);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0xaf8] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0xab0] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0xa68] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0xa20] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0x9d8] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x990] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x948] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0x900] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar32);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0x8b8] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0x870] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0x828] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0x7e0] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0x798] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x750] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x708] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0x6c0] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar31);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0x678] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0x630] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0x5e8] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0x5a0] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0x558] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x510] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x4c8] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0x480] = true;
      }
      auVar39 = vporq_avx512f(auVar38,auVar30);
      uVar19 = vpcmpuq_avx512f(auVar39,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0x438] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0x3f0] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0x3a8] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0x360] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0x318] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x2d0] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x288] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        pbVar15[-0x240] = true;
      }
      auVar38 = vporq_avx512f(auVar38,auVar29);
      uVar19 = vpcmpuq_avx512f(auVar38,auVar37,2);
      if ((uVar19 & 1) != 0) {
        pbVar15[-0x1f8] = true;
      }
      if ((uVar19 & 2) != 0) {
        pbVar15[-0x1b0] = true;
      }
      if ((uVar19 & 4) != 0) {
        pbVar15[-0x168] = true;
      }
      if ((uVar19 & 8) != 0) {
        pbVar15[-0x120] = true;
      }
      if ((uVar19 & 0x10) != 0) {
        pbVar15[-0xd8] = true;
      }
      if ((uVar19 & 0x20) != 0) {
        pbVar15[-0x90] = true;
      }
      if ((uVar19 & 0x40) != 0) {
        pbVar15[-0x48] = true;
      }
      if ((uVar19 & 0x80) != 0) {
        *pbVar15 = true;
      }
      uVar14 = uVar14 + 0x40;
      pbVar15 = pbVar15 + 0x1200;
    } while (((ulong)((long)pFVar4 + (-0x48 - (long)pFVar3)) / 0x48 + 0x40 & 0xffffffffffffffc0) !=
             uVar14);
  }
  merge_nodes_upwards<int,int>
            (local_1f0,local_1c0,local_18c,local_188,
             (vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
              *)local_178.
                super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
  local_148.model_._0_4_ =
       (int)((ulong)((long)local_178.
                           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_178.
                          super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  if (local_1f0 <= (int)local_148.model_) {
    local_148.model_._0_4_ = local_1f0;
  }
  if (-1 < (int)local_148.model_) {
    uVar21 = (int)local_148.model_ + 1;
    uVar14 = 0;
    do {
      pFVar5 = local_178.
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = local_178.
                    super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].
                    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pFVar5; __args = __args + 1
          ) {
        if (__args->use == true) {
          __position._M_current = *(FTNode **)(this_00 + 8);
          if (__position._M_current == *(FTNode **)(this_00 + 0x10)) {
            std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>::
            _M_realloc_insert<alex::fanout_tree::FTNode_const&>(this_00,__position,__args);
          }
          else {
            uVar12 = *(undefined4 *)&__args->field_0x44;
            (__position._M_current)->num_keys = __args->num_keys;
            *(undefined4 *)&(__position._M_current)->field_0x44 = uVar12;
            iVar16 = __args->node_id;
            dVar1 = __args->cost;
            iVar22 = __args->left_boundary;
            iVar20 = __args->right_boundary;
            bVar11 = __args->use;
            uVar13 = *(undefined7 *)&__args->field_0x19;
            dVar7 = __args->expected_avg_search_iterations;
            dVar8 = __args->expected_avg_shifts;
            dVar9 = __args->a;
            dVar10 = __args->b;
            (__position._M_current)->level = __args->level;
            (__position._M_current)->node_id = iVar16;
            (__position._M_current)->cost = dVar1;
            (__position._M_current)->left_boundary = iVar22;
            (__position._M_current)->right_boundary = iVar20;
            (__position._M_current)->use = bVar11;
            *(undefined7 *)&(__position._M_current)->field_0x19 = uVar13;
            (__position._M_current)->expected_avg_search_iterations = dVar7;
            (__position._M_current)->expected_avg_shifts = dVar8;
            (__position._M_current)->a = dVar9;
            (__position._M_current)->b = dVar10;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x48;
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
  }
  __first._M_current = *(FTNode **)this_00;
  __last._M_current = *(FTNode **)(this_00 + 8);
  if (__first._M_current != __last._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT(((long)__last._M_current - (long)__first._M_current >> 3)
                                          * -0x71c71c71c71c71c7) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )&local_148);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )&local_148);
  }
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector(&local_178);
  if (local_1b8 != (void *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  return local_1f0;
}

Assistant:

int find_best_fanout_existing_node(const AlexModelNode<T, P>* parent,
                                   int bucketID, int total_keys,
                                   std::vector<FTNode>& used_fanout_tree_nodes,
                                   int max_fanout) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  auto node = static_cast<AlexDataNode<T, P>*>(parent->children_[bucketID]);
  int num_keys = node->num_keys_;
  int best_level = 0;
  double best_cost = std::numeric_limits<double>::max();
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;

  int repeats = 1 << node->duplication_factor_;
  int start_bucketID =
      bucketID - (bucketID % repeats);  // first bucket with same child
  int end_bucketID =
      start_bucketID + repeats;  // first bucket with different child
  LinearModel<T> base_model;
  if (parent->model_.a_ == 0){
    base_model.a_ = 0;
    base_model.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
  }
  else{
    double left_boundary_value =
      (start_bucketID - parent->model_.b_) / parent->model_.a_;
    double right_boundary_value =
        (end_bucketID - parent->model_.b_) / parent->model_.a_;
    base_model.a_ = 1.0 / (right_boundary_value - left_boundary_value);
    base_model.b_ = -1.0 * base_model.a_ * left_boundary_value;
  }

  for (int fanout = 1, fanout_tree_level = 0; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = 0.0;
    double a = base_model.a_ * fanout;
    double b = base_model.b_ * fanout;
    int left_boundary = 0;
    int right_boundary = 0;
    for (int i = 0; i < fanout; i++) {
      left_boundary = right_boundary;
      right_boundary = i == fanout - 1 ? node->data_capacity_
                                       : node->lower_bound(((i + 1) - b) / a);
      if (left_boundary == right_boundary) {
        new_level.push_back({fanout_tree_level, i, 0, left_boundary,
                             right_boundary, false, 0, 0, 0, 0, 0});
        continue;
      }
      int num_actual_keys = 0;
      LinearModel<T> model;
      typename AlexDataNode<T, P>::const_iterator_type it(node, left_boundary);
      LinearModelBuilder<T> builder(&model);
      for (int j = 0; it.cur_idx_ < right_boundary && !it.is_end(); it++, j++) {
        builder.add(it.key(), j);
        num_actual_keys++;
      }
      builder.build();

      double empirical_insert_frac = node->frac_inserts();
      DataNodeStats stats;
      double node_cost =
          AlexDataNode<T, P>::compute_expected_cost_from_existing(
              node, left_boundary, right_boundary,
              AlexDataNode<T, P>::kInitDensity_, empirical_insert_frac, &model,
              &stats);

      cost += node_cost * num_actual_keys / num_keys;

      new_level.push_back({fanout_tree_level, i, node_cost, left_boundary,
                           right_boundary, false, stats.num_search_iterations,
                           stats.num_shifts, model.a_, model.b_,
                           num_actual_keys});
    }
    // model weight reflects that it has global effect, not local effect
    double traversal_cost =
        kNodeLookupsWeight +
        (kModelSizeWeight * fanout *
         (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
    cost += traversal_cost;
    fanout_costs.push_back(cost);
    // stop after expanding fanout increases cost twice in a row
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  merge_nodes_upwards<T, P>(best_level, best_cost, num_keys, total_keys,
                            fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return best_level;
}